

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attentional.h
# Opt level: O0

void __thiscall
dynet::AttentionalModel<dynet::LSTMBuilder>::display_tikz
          (AttentionalModel<dynet::LSTMBuilder> *this,vector<int,_std::allocator<int>_> *source,
          vector<int,_std::allocator<int>_> *target,ComputationGraph *cg,Expression *alignment,
          Dict *sd,Dict *td)

{
  initializer_list<unsigned_int> x;
  Dim *pDVar1;
  uint uVar2;
  size_type sVar3;
  ostream *poVar4;
  void *this_00;
  ostream *poVar5;
  string *psVar6;
  Dim *in_RCX;
  vector<int,_std::allocator<int>_> *in_RDX;
  vector<int,_std::allocator<int>_> *in_RSI;
  long in_R8;
  Dict *in_R9;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qa_02;
  undefined8 extraout_XMM0_Qa_03;
  undefined8 extraout_XMM0_Qa_04;
  undefined8 extraout_XMM0_Qa_05;
  undefined8 extraout_XMM0_Qa_06;
  undefined1 auVar7 [16];
  undefined1 auVar8 [64];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_04 [56];
  undefined1 extraout_var_05 [56];
  undefined1 extraout_var_06 [56];
  undefined1 extraout_var_07 [56];
  int val;
  float v;
  uint j_1;
  uint i_1;
  float eps;
  uint i;
  uint j;
  Tensor *a;
  uint J;
  uint I;
  int *in_stack_ffffffffffffff38;
  Dict *in_stack_ffffffffffffff40;
  Dim *this_01;
  undefined4 in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  uint local_98;
  uint local_94;
  uint *local_90;
  undefined8 local_88;
  Dim local_80;
  float local_5c;
  uint local_58;
  uint local_54;
  float local_50;
  uint local_4c;
  uint local_48;
  VariableIndex local_44;
  Dim *local_40;
  uint local_38;
  uint local_34;
  Dict *local_30;
  long local_28;
  Dim *local_20;
  vector<int,_std::allocator<int>_> *local_18;
  vector<int,_std::allocator<int>_> *local_10;
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 extraout_var [56];
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  sVar3 = std::vector<int,_std::allocator<int>_>::size(in_RDX);
  local_34 = (uint)sVar3;
  sVar3 = std::vector<int,_std::allocator<int>_>::size(local_10);
  local_38 = (uint)sVar3;
  VariableIndex::VariableIndex(&local_44,(VariableIndex *)(local_28 + 8));
  local_40 = (Dim *)dynet::ComputationGraph::get_value((VariableIndex)(uint)local_20);
  uVar2 = Dim::operator[](local_40,0);
  poVar4 = (ostream *)std::ostream::operator<<(&std::cout,uVar2);
  poVar4 = std::operator<<(poVar4," x ");
  uVar2 = Dim::operator[](local_40,1);
  this_00 = (void *)std::ostream::operator<<(poVar4,uVar2);
  auVar8._0_8_ = std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  auVar8._8_56_ = extraout_var;
  std::operator<<((ostream *)&std::cout,"\\begin{tikzpicture}[scale=0.5]\n");
  this_01 = local_20;
  for (local_48 = 0; auVar7 = auVar8._0_16_, local_48 < local_38; local_48 = local_48 + 1) {
    poVar5 = std::operator<<((ostream *)&std::cout,"\\node[anchor=west,rotate=90] at (");
    auVar7 = vcvtusi2sd_avx512f(auVar7,local_48);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,auVar7._0_8_ + 0.5);
    auVar9._8_56_ = extraout_var_00;
    auVar9._0_8_ = extraout_XMM0_Qa;
    auVar7 = auVar9._0_16_;
    poVar5 = std::operator<<(poVar5,", ");
    auVar7 = vcvtusi2sd_avx512f(auVar7,local_34);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,auVar7._0_8_ + 0.2);
    auVar8._8_56_ = extraout_var_01;
    auVar8._0_8_ = extraout_XMM0_Qa_00;
    poVar5 = std::operator<<(poVar5,") { ");
    in_stack_ffffffffffffff40 = local_30;
    std::vector<int,_std::allocator<int>_>::operator[](local_10,(ulong)local_48);
    psVar6 = Dict::convert_abi_cxx11_(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    poVar5 = std::operator<<(poVar5,(string *)psVar6);
    std::operator<<(poVar5," };\n");
  }
  for (local_4c = 0; auVar7 = auVar8._0_16_, local_4c < local_34; local_4c = local_4c + 1) {
    poVar5 = std::operator<<((ostream *)&std::cout,"\\node[anchor=west] at (");
    auVar7 = vcvtusi2sd_avx512f(auVar7,local_38);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,auVar7._0_8_ + 0.2);
    auVar10._8_56_ = extraout_var_02;
    auVar10._0_8_ = extraout_XMM0_Qa_01;
    auVar7 = auVar10._0_16_;
    poVar5 = std::operator<<(poVar5,", ");
    auVar7 = vcvtusi2sd_avx512f(auVar7,local_34 - local_4c);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,auVar7._0_8_ - 0.5);
    auVar8._8_56_ = extraout_var_03;
    auVar8._0_8_ = extraout_XMM0_Qa_02;
    poVar5 = std::operator<<(poVar5,") { ");
    std::vector<int,_std::allocator<int>_>::operator[](local_18,(ulong)local_4c);
    psVar6 = Dict::convert_abi_cxx11_(in_stack_ffffffffffffff40,(int *)poVar5);
    poVar5 = std::operator<<(poVar5,(string *)psVar6);
    std::operator<<(poVar5," };\n");
  }
  local_50 = 0.01;
  for (local_54 = 0; local_54 < local_34; local_54 = local_54 + 1) {
    for (local_58 = 0; pDVar1 = local_40, local_58 < local_38; local_58 = local_58 + 1) {
      local_98 = local_58;
      local_94 = local_54;
      local_90 = &local_98;
      local_88 = 2;
      x._M_len._0_4_ = in_stack_ffffffffffffff60;
      x._M_array = (iterator)poVar4;
      x._M_len._4_4_ = in_stack_ffffffffffffff64;
      Dim::Dim(this_01,x);
      local_5c = (float)dynet::TensorTools::AccessElement((Tensor *)pDVar1,&local_80);
      in_stack_ffffffffffffff64 = (int)(local_5c * 100.0);
      poVar5 = std::operator<<((ostream *)&std::cout,"\\fill[blue!");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,in_stack_ffffffffffffff64);
      auVar11._8_56_ = extraout_var_04;
      auVar11._0_8_ = extraout_XMM0_Qa_03;
      auVar7 = auVar11._0_16_;
      poVar5 = std::operator<<(poVar5,"!black] (");
      auVar7 = vcvtusi2ss_avx512f(auVar7,local_58);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,auVar7._0_4_ + local_50);
      auVar12._8_56_ = extraout_var_05;
      auVar12._0_8_ = extraout_XMM0_Qa_04;
      auVar7 = auVar12._0_16_;
      poVar5 = std::operator<<(poVar5,", ");
      auVar7 = vcvtusi2ss_avx512f(auVar7,(local_34 - local_54) + -1);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,auVar7._0_4_ + local_50);
      auVar13._8_56_ = extraout_var_06;
      auVar13._0_8_ = extraout_XMM0_Qa_05;
      auVar7 = auVar13._0_16_;
      poVar5 = std::operator<<(poVar5,") rectangle (");
      auVar7 = vcvtusi2ss_avx512f(auVar7,local_58 + 1);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,auVar7._0_4_ - local_50);
      auVar14._8_56_ = extraout_var_07;
      auVar14._0_8_ = extraout_XMM0_Qa_06;
      auVar7 = auVar14._0_16_;
      poVar5 = std::operator<<(poVar5,",");
      auVar7 = vcvtusi2ss_avx512f(auVar7,local_34 - local_54);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,auVar7._0_4_ - local_50);
      std::operator<<(poVar5,");\n");
    }
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"\\draw[step=1cm,color=gray] (0,0) grid (");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_38);
  poVar4 = std::operator<<(poVar4,", ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_34);
  std::operator<<(poVar4,");\n");
  std::operator<<((ostream *)&std::cout,"\\end{tikzpicture}\n");
  return;
}

Assistant:

void 
AttentionalModel<Builder>::display_tikz(const std::vector<int> &source, const std::vector<int>& target, 
                          ComputationGraph &cg, const Expression &alignment, Dict &sd, Dict &td)
{
    using namespace std;

    // display the alignment
    unsigned I = target.size();
    unsigned J = source.size();

    const Tensor &a = cg.get_value(alignment.i);
    cout << a.d[0] << " x " << a.d[1] << endl;

    cout << "\\begin{tikzpicture}[scale=0.5]\n";
    for (unsigned j = 0; j < J; ++j) 
        cout << "\\node[anchor=west,rotate=90] at (" << j+0.5 << ", " << I+0.2 << ") { " << sd.convert(source[j]) << " };\n";
    for (unsigned i = 0; i < I; ++i) 
        cout << "\\node[anchor=west] at (" << J+0.2 << ", " << I-i-0.5 << ") { " << td.convert(target[i]) << " };\n";

    float eps = 0.01;
    for (unsigned i = 0; i < I; ++i) {
        for (unsigned j = 0; j < J; ++j) {
            float v = TensorTools::AccessElement(a, Dim({(unsigned int)j, (unsigned int)i}));
            //int val = int(pow(v, 0.5) * 100);
            int val = int(v * 100);
            cout << "\\fill[blue!" << val << "!black] (" << j+eps << ", " << I-i-1+eps << ") rectangle (" << j+1-eps << "," << I-i-eps << ");\n";
        }
    }
    cout << "\\draw[step=1cm,color=gray] (0,0) grid (" << J << ", " << I << ");\n";
    cout << "\\end{tikzpicture}\n";
}